

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

Ptr<Device> __thiscall
myvk::Device::Create
          (Device *this,Ptr<PhysicalDevice> *physical_device,QueueSelectorFunc *queue_selector_func,
          PhysicalDeviceFeatures *features,
          vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  VkPhysicalDeviceVulkan11Features *pVVar1;
  VkPhysicalDeviceVulkan12Features *__dest;
  VkPhysicalDeviceVulkan13Features *pVVar2;
  void *pvVar3;
  undefined4 uVar4;
  element_type *peVar5;
  VkBool32 VVar6;
  VkBool32 VVar7;
  VkBool32 VVar8;
  VkBool32 VVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  VkBool32 VVar12;
  VkBool32 VVar13;
  VkBool32 VVar14;
  VkBool32 VVar15;
  VkBool32 VVar16;
  VkBool32 VVar17;
  PhysicalDeviceFeatures *pPVar18;
  PhysicalDeviceFeatures *pPVar19;
  VkResult VVar20;
  undefined8 uVar21;
  long lVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  VkPhysicalDeviceVulkan13Features *pVVar24;
  VkPhysicalDeviceVulkan13Features *pVVar25;
  byte bVar26;
  Ptr<Device> PVar27;
  shared_ptr<myvk::Device> ret;
  vector<float,_std::allocator<float>_> queue_priorities;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queue_create_infos;
  vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> queue_selections;
  QueueSelectionResolver queue_resolver;
  Ptr<Device> local_138;
  PhysicalDeviceFeatures *local_120;
  vector<float,_std::allocator<float>_> local_118;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> local_f8;
  vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> local_e0;
  undefined1 local_c8 [40];
  char **ppcStack_a0;
  ulong local_98;
  pointer local_90;
  PhysicalDeviceFeatures *local_88;
  QueueSelectionResolver local_78;
  
  bVar26 = 0;
  local_120 = features;
  std::__shared_ptr<myvk::Device,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Device>>
            ((__shared_ptr<myvk::Device,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             (allocator<myvk::Device> *)local_c8);
  ((local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  m_physical_device_ptr).super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&((local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_physical_device_ptr).
              super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  local_c8._0_8_ =
       (physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_c8._8_8_ =
       (physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count + 1;
    }
  }
  if ((queue_selector_func->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar21 = std::__throw_bad_function_call();
    std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector(&local_e0);
    if ((element_type *)
        local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    _Unwind_Resume(uVar21);
  }
  (*queue_selector_func->_M_invoker)
            (&local_e0,(_Any_data *)queue_selector_func,
             (shared_ptr<const_myvk::PhysicalDevice> *)local_c8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  if (local_e0.super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_e0.super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    goto LAB_001aa2df;
  }
  QueueSelectionResolver::QueueSelectionResolver(&local_78,physical_device,&local_e0);
  local_f8.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  QueueSelectionResolver::EnumerateDeviceQueueCreateInfos(&local_78,&local_f8,&local_118);
  pPVar18 = local_120;
  local_c8._32_8_ = (void *)0x0;
  ppcStack_a0 = (char **)0x0;
  local_c8._0_8_ = (element_type *)0x3;
  local_c8._24_8_ =
       local_f8.
       super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_c8._16_8_ =
       (ulong)(uint)((int)((ulong)((long)local_f8.
                                         super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_f8.
                                        super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x33333333) << 0x20;
  local_88 = local_120;
  local_90 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = (ulong)((long)(extensions->
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)local_90) >> 3 & 0xffffffff;
  pVVar1 = &local_120->vk11;
  local_c8._8_8_ = pVVar1;
  VVar20 = (*vkCreateDevice)((((local_138.
                                super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_physical_device_ptr).
                              super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->m_physical_device,(VkDeviceCreateInfo *)local_c8,
                             (VkAllocationCallbacks *)0x0,
                             &(local_138.
                               super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_device);
  if (VVar20 == VK_SUCCESS) {
    volkLoadDevice((local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_device);
    VVar20 = create_allocator(local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    if (VVar20 != VK_SUCCESS) goto LAB_001aa285;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = (pointer)0x0;
    local_c8._32_8_ = (void *)0x0;
    local_c8._0_8_ = (element_type *)0x11;
    VVar20 = (*vkCreatePipelineCache)
                       ((local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_device,(VkPipelineCacheCreateInfo *)local_c8,
                        (VkAllocationCallbacks *)0x0,
                        &(local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_pipeline_cache);
    pPVar19 = local_120;
    peVar5 = local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (VVar20 != VK_SUCCESS) goto LAB_001aa285;
    memcpy(&(local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_features,local_120,0xdc);
    uVar4 = *(undefined4 *)&pVVar1->field_0x4;
    pvVar3 = (pPVar18->vk11).pNext;
    VVar6 = (pPVar18->vk11).storageBuffer16BitAccess;
    VVar7 = (pPVar18->vk11).uniformAndStorageBuffer16BitAccess;
    VVar8 = (pPVar18->vk11).storagePushConstant16;
    VVar9 = (pPVar18->vk11).storageInputOutput16;
    VVar10 = (pPVar18->vk11).multiview;
    VVar11 = (pPVar18->vk11).multiviewGeometryShader;
    VVar12 = (pPVar18->vk11).multiviewTessellationShader;
    VVar13 = (pPVar18->vk11).variablePointersStorageBuffer;
    VVar14 = (pPVar18->vk11).variablePointers;
    VVar15 = (pPVar18->vk11).protectedMemory;
    VVar16 = (pPVar18->vk11).samplerYcbcrConversion;
    VVar17 = (pPVar18->vk11).shaderDrawParameters;
    (peVar5->m_features).vk11.sType = pVVar1->sType;
    *(undefined4 *)&(peVar5->m_features).vk11.field_0x4 = uVar4;
    (peVar5->m_features).vk11.pNext = pvVar3;
    (peVar5->m_features).vk11.storageBuffer16BitAccess = VVar6;
    (peVar5->m_features).vk11.uniformAndStorageBuffer16BitAccess = VVar7;
    (peVar5->m_features).vk11.storagePushConstant16 = VVar8;
    (peVar5->m_features).vk11.storageInputOutput16 = VVar9;
    (peVar5->m_features).vk11.multiview = VVar10;
    (peVar5->m_features).vk11.multiviewGeometryShader = VVar11;
    (peVar5->m_features).vk11.multiviewTessellationShader = VVar12;
    (peVar5->m_features).vk11.variablePointersStorageBuffer = VVar13;
    (peVar5->m_features).vk11.variablePointers = VVar14;
    (peVar5->m_features).vk11.protectedMemory = VVar15;
    (peVar5->m_features).vk11.samplerYcbcrConversion = VVar16;
    (peVar5->m_features).vk11.shaderDrawParameters = VVar17;
    __dest = &(peVar5->m_features).vk12;
    memcpy(__dest,&pPVar19->vk12,0xd0);
    pVVar2 = &(peVar5->m_features).vk13;
    pVVar24 = &pPVar19->vk13;
    pVVar25 = pVVar2;
    for (lVar22 = 10; lVar22 != 0; lVar22 = lVar22 + -1) {
      uVar4 = *(undefined4 *)&pVVar24->field_0x4;
      pVVar25->sType = pVVar24->sType;
      *(undefined4 *)&pVVar25->field_0x4 = uVar4;
      pVVar24 = (VkPhysicalDeviceVulkan13Features *)((long)pVVar24 + (ulong)bVar26 * -0x10 + 8);
      pVVar25 = (VkPhysicalDeviceVulkan13Features *)((long)pVVar25 + (ulong)bVar26 * -0x10 + 8);
    }
    (peVar5->m_features).vk11.pNext = __dest;
    (peVar5->m_features).vk12.pNext = pVVar2;
    (peVar5->m_features).vk13.pNext = (void *)0x0;
    QueueSelectionResolver::FetchDeviceQueues(&local_78,&local_138);
    _Var23._M_pi = local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Base)._vptr_Base =
         (_func_int **)local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var23._M_pi;
    local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Device *)0x0;
  }
  else {
LAB_001aa285:
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>,_std::allocator<std::vector<myvk::QueueSelection_*,_std::allocator<myvk::QueueSelection_*>_>_>_>_>_>_>
  ::~_Rb_tree(&local_78.m_queue_creations._M_t);
  std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector
            (&local_78.m_queue_selections);
LAB_001aa2df:
  std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector(&local_e0);
  _Var23._M_pi = extraout_RDX;
  if ((element_type *)
      local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var23._M_pi = extraout_RDX_00;
  }
  PVar27.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var23._M_pi;
  PVar27.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Device>)PVar27.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Device> Device::Create(const Ptr<PhysicalDevice> &physical_device, const QueueSelectorFunc& queue_selector_func,
                           const PhysicalDeviceFeatures &features, const std::vector<const char *> &extensions) {
	auto ret = std::make_shared<Device>();
	ret->m_physical_device_ptr = physical_device;

	std::vector<QueueSelection> queue_selections = queue_selector_func(physical_device);
	if (queue_selections.empty())
		return nullptr;
	QueueSelectionResolver queue_resolver{physical_device, std::move(queue_selections)};
	std::vector<VkDeviceQueueCreateInfo> queue_create_infos;
	std::vector<float> queue_priorities;
	queue_resolver.EnumerateDeviceQueueCreateInfos(&queue_create_infos, &queue_priorities);

	if (ret->create_device(queue_create_infos, extensions, features) != VK_SUCCESS)
		return nullptr;
	volkLoadDevice(ret->m_device);
	if (ret->create_allocator() != VK_SUCCESS)
		return nullptr;
	if (ret->create_pipeline_cache() != VK_SUCCESS)
		return nullptr;
	ret->m_features = features;
	queue_resolver.FetchDeviceQueues(ret);
	return ret;
}